

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
attach<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
          (Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *this,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachments)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  kj *this_00;
  NoInfer<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_> *in_RDX;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *params;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
  local_50;
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  NoInfer<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_> *local_20;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachments_local;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  this_00 = (kj *)fwd<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>(local_20);
  tuple<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>(&local_50,this_00,params);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>,kj::_::PromiseDisposer,kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
            ((PromiseDisposer *)&local_30,next,&local_50);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)this
             ,false,(OwnPromiseNode *)&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::~OneOf(&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}